

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::
ExceptionOr<kj::_::Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>_>_>
::~ExceptionOr(ExceptionOr<kj::_::Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>_>_>
               *this)

{
  OwnPromiseNode node;
  PromiseArenaMember *node_00;
  
  if ((this->value).ptr.isSet == true) {
    node.ptr = (this->value).ptr.field_1.value.impl.
               super_TupleElement<1U,_kj::Promise<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>_>
               .value.super_PromiseBase.node.ptr;
    if (&(node.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
      (this->value).ptr.field_1.value.impl.
      super_TupleElement<1U,_kj::Promise<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>_>
      .value.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      PromiseDisposer::dispose(&(node.ptr)->super_PromiseArenaMember);
    }
    node_00 = &((this->value).ptr.field_1.value.impl.
                super_TupleElement<0U,_kj::Promise<kj::HttpClient::ConnectRequest::Status>_>.value.
                super_PromiseBase.node.ptr)->super_PromiseArenaMember;
    if (node_00 != (PromiseArenaMember *)0x0) {
      (this->value).ptr.field_1.value.impl.
      super_TupleElement<0U,_kj::Promise<kj::HttpClient::ConnectRequest::Status>_>.value.
      super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      PromiseDisposer::dispose(node_00);
    }
  }
  if ((this->super_ExceptionOrValue).exception.ptr.isSet == true) {
    Exception::~Exception(&(this->super_ExceptionOrValue).exception.ptr.field_1.value);
    return;
  }
  return;
}

Assistant:

ExceptionOr(T&& value): value(kj::mv(value)) {}